

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O2

void __thiscall StackTraceTableTestHelper::AddTrace(StackTraceTableTestHelper *this,StackTrace *t)

{
  _Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false> __dest;
  __uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  local_28;
  
  __dest._M_head_impl = (Entry *)operator_new(0x110);
  memcpy(__dest._M_head_impl,t,0x108);
  ((__dest._M_head_impl)->next)._M_t =
       (__uniq_ptr_data<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>,_true,_true>
        )(this->head_)._M_t.
         super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
         ._M_t.
         super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
         .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl;
  (this->head_)._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       __dest._M_head_impl;
  local_28._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_28);
  return;
}

Assistant:

void AddTrace(const StackTrace& t) {
    EntryPtr e{new Entry{t}};
    head_.swap(e->next);
    head_.swap(e);
  }